

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::to_func_call_arg_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,Parameter *arg,uint32_t id)

{
  MSLFormatResolution MVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  TypedID<(spirv_cross::Types)0> *pTVar5;
  TypedID<(spirv_cross::Types)0> *pTVar6;
  CompilerError *pCVar7;
  size_type sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  uint *in_R9;
  char (*in_stack_fffffffffffff838) [2];
  uint32_t local_7a0;
  uint32_t local_798;
  uint32_t local_714;
  uint32_t local_708;
  string local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  uint32_t local_5fc;
  SPIRVariable *local_5f8;
  SPIRVariable *backing_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  VariableID local_5ac;
  string local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  allocator local_461;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  allocator local_439;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  allocator local_411;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  allocator local_3e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  allocator local_3c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  allocator local_399;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  allocator local_371;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  allocator local_349;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  allocator local_321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  allocator local_2f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  undefined1 local_2d8 [8];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  samp_args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180;
  string local_160;
  undefined1 local_140 [8];
  uint32_t i;
  uint32_t planes;
  MSLConstexprSampler *constexpr_sampler;
  SPIRVariable *var;
  undefined1 local_120 [4];
  uint32_t var_id;
  string local_100;
  string local_e0;
  TypedID<(spirv_cross::Types)0> local_c0;
  TypedID<(spirv_cross::Types)0> local_bc;
  TypedID<(spirv_cross::Types)0> *local_b8;
  TypedID<(spirv_cross::Types)0> *itr;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *constants;
  SPIRConstant *local_88;
  SPIRConstant *c;
  string local_60;
  byte local_3e;
  byte local_3d;
  bool arg_is_dynamic_img_sampler;
  bool is_dynamic_img_sampler;
  SPIRType *local_30;
  SPIRType *type;
  Parameter *pPStack_20;
  uint32_t id_local;
  Parameter *arg_local;
  CompilerMSL *this_local;
  string *arg_str;
  
  type._3_1_ = 0;
  type._4_4_ = id;
  pPStack_20 = arg;
  arg_local = (Parameter *)this;
  this_local = (CompilerMSL *)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_30 = Compiler::expression_type((Compiler *)this,type._4_4_);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pPStack_20->id);
  local_3d = Compiler::has_extended_decoration
                       ((Compiler *)this,uVar3,SPIRVCrossDecorationDynamicImageSampler);
  local_3e = Compiler::has_extended_decoration
                       ((Compiler *)this,type._4_4_,SPIRVCrossDecorationDynamicImageSampler);
  if (((local_3d & 1) != 0) && (!(bool)local_3e)) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_30->image);
    pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&c,this,pSVar4,0);
    join<char_const(&)[24],std::__cxx11::string,char_const(&)[3]>
              (&local_60,(spirv_cross *)"spvDynamicImageSampler<",(char (*) [24])&c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5ab3c1,
               (char (*) [3])in_R8);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::__cxx11::string::~string((string *)&c);
  }
  local_88 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,type._4_4_);
  if ((((this->msl_options).force_native_arrays & 1U) != 0) && (local_88 != (SPIRConstant *)0x0)) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_88->super_IVariant).field_0xc)
    ;
    pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
    bVar2 = VectorView<unsigned_int>::empty(&(pSVar4->array).super_VectorView<unsigned_int>);
    if (!bVar2) {
      join<char_const(&)[2],unsigned_int&,char_const(&)[12]>
                ((string *)&constants,(spirv_cross *)0x597e50,(char (*) [2])((long)&type + 4),
                 (uint *)"_array_copy",(char (*) [12])in_R8);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&constants);
      ::std::__cxx11::string::~string((string *)&constants);
      itr = (TypedID<(spirv_cross::Types)0> *)
            &((this->super_CompilerGLSL).super_Compiler.current_function)->
             constant_arrays_needed_on_stack;
      pTVar5 = ::std::
               begin<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                         ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)itr);
      pTVar6 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                         ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)itr);
      TypedID<(spirv_cross::Types)0>::TypedID(&local_bc,type._4_4_);
      pTVar5 = ::std::
               find<spirv_cross::TypedID<(spirv_cross::Types)0>*,spirv_cross::TypedID<(spirv_cross::Types)0>>
                         (pTVar5,pTVar6,&local_bc);
      local_b8 = pTVar5;
      pTVar6 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                         ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)itr);
      if (pTVar5 == pTVar6) {
        Compiler::force_recompile((Compiler *)this);
        pTVar5 = itr;
        TypedID<(spirv_cross::Types)0>::TypedID(&local_c0,type._4_4_);
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::push_back
                  ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)pTVar5,&local_c0
                  );
      }
      goto LAB_003786b6;
    }
  }
  bVar2 = CompilerGLSL::should_dereference_caller_param(&this->super_CompilerGLSL,type._4_4_);
  pSVar4 = local_30;
  if (bVar2) {
    CompilerGLSL::to_func_call_arg_abi_cxx11_
              (&local_100,&this->super_CompilerGLSL,pPStack_20,type._4_4_);
    CompilerGLSL::dereference_expression(&local_e0,&this->super_CompilerGLSL,pSVar4,&local_100);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_100);
  }
  else {
    CompilerGLSL::to_func_call_arg_abi_cxx11_
              ((string *)local_120,&this->super_CompilerGLSL,pPStack_20,type._4_4_);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_120);
    ::std::__cxx11::string::~string((string *)local_120);
  }
LAB_003786b6:
  var._4_4_ = 0;
  constexpr_sampler =
       (MSLConstexprSampler *)
       Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,type._4_4_);
  if ((SPIRVariable *)constexpr_sampler != (SPIRVariable *)0x0) {
    var._4_4_ = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&((SPIRVariable *)constexpr_sampler)->basevariable);
  }
  if ((local_3e & 1) == 0) {
    if (var._4_4_ == 0) {
      local_708 = type._4_4_;
    }
    else {
      local_708 = var._4_4_;
    }
    _i = find_constexpr_sampler(this,local_708);
    if (local_30->basetype == SampledImage) {
      local_140._4_4_ = 1;
      if (((_i != (MSLConstexprSampler *)0x0) && ((_i->ycbcr_conversion_enable & 1U) != 0)) &&
         (local_140._4_4_ = _i->planes, (pPStack_20->alias_global_variable & 1U) == 0)) {
        add_spv_func_and_recompile(this,SPVFuncImplDynamicImageSampler);
      }
      for (local_140._0_4_ = 1; (uint)local_140._0_4_ < (uint)local_140._4_4_;
          local_140._0_4_ = local_140._0_4_ + 1) {
        CompilerGLSL::to_func_call_arg_abi_cxx11_
                  (&local_180,&this->super_CompilerGLSL,pPStack_20,type._4_4_);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140;
        join<char_const(&)[3],std::__cxx11::string,std::__cxx11::string&,unsigned_int&>
                  (&local_160,(spirv_cross *)0x5a8753,(char (*) [3])&local_180,
                   &this->plane_name_suffix,in_R8,in_R9);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_160);
        ::std::__cxx11::string::~string((string *)&local_160);
        ::std::__cxx11::string::~string((string *)&local_180);
      }
      if ((local_30->image).dim != Buffer) {
        if (var._4_4_ == 0) {
          local_714 = type._4_4_;
        }
        else {
          local_714 = var._4_4_;
        }
        to_sampler_expression_abi_cxx11_
                  ((string *)(samp_args.stack_storage.aligned_char + 0xf8),this,local_714);
        ::std::operator+(&local_1a0,", ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (samp_args.stack_storage.aligned_char + 0xf8));
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1a0);
        ::std::__cxx11::string::~string((string *)&local_1a0);
        ::std::__cxx11::string::~string((string *)(samp_args.stack_storage.aligned_char + 0xf8));
      }
      if ((((local_3d & 1) != 0) && (_i != (MSLConstexprSampler *)0x0)) &&
         ((_i->ycbcr_conversion_enable & 1U) != 0)) {
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_2d8);
        MVar1 = _i->resolution;
        if (MVar1 != MSL_FORMAT_RESOLUTION_444) {
          if (MVar1 == MSL_FORMAT_RESOLUTION_422) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_2f8,"spvFormatResolution::_422",&local_2f9);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)local_2d8,&local_2f8);
            ::std::__cxx11::string::~string((string *)&local_2f8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
          }
          else {
            if (MVar1 != MSL_FORMAT_RESOLUTION_420) {
              pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError(pCVar7,"Invalid format resolution.");
              __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_320,"spvFormatResolution::_420",&local_321);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)local_2d8,&local_320);
            ::std::__cxx11::string::~string((string *)&local_320);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_321);
          }
        }
        if (_i->chroma_filter != MSL_SAMPLER_FILTER_NEAREST) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_348,"spvChromaFilter::linear",&local_349);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_2d8,&local_348);
          ::std::__cxx11::string::~string((string *)&local_348);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_349);
        }
        if (_i->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_370,"spvXChromaLocation::midpoint",&local_371);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_2d8,&local_370);
          ::std::__cxx11::string::~string((string *)&local_370);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_371);
        }
        if (_i->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_398,"spvYChromaLocation::midpoint",&local_399);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_2d8,&local_398);
          ::std::__cxx11::string::~string((string *)&local_398);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_399);
        }
        switch(_i->ycbcr_model) {
        case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
          break;
        case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_3c0,"spvYCbCrModelConversion::ycbcr_identity",&local_3c1);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_2d8,&local_3c0);
          ::std::__cxx11::string::~string((string *)&local_3c0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
          break;
        case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_3e8,"spvYCbCrModelConversion::ycbcr_bt_709",&local_3e9);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_2d8,&local_3e8);
          ::std::__cxx11::string::~string((string *)&local_3e8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
          break;
        case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_410,"spvYCbCrModelConversion::ycbcr_bt_601",&local_411);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_2d8,&local_410);
          ::std::__cxx11::string::~string((string *)&local_410);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_411);
          break;
        case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_438,"spvYCbCrModelConversion::ycbcr_bt_2020",&local_439);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_2d8,&local_438);
          ::std::__cxx11::string::~string((string *)&local_438);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_439);
          break;
        default:
          pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar7,"Invalid Y\'CbCr model conversion.");
          __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if (_i->ycbcr_range != MSL_SAMPLER_YCBCR_RANGE_ITU_FULL) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_460,"spvYCbCrRange::itu_narrow",&local_461);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_2d8,&local_460);
          ::std::__cxx11::string::~string((string *)&local_460);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_461);
        }
        join<char_const(&)[18],unsigned_int_const&,char_const(&)[2]>
                  (&local_488,(spirv_cross *)"spvComponentBits(",(char (*) [18])&_i->bpc,
                   (uint *)0x5b7d4b,(char (*) [2])in_R8);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_2d8,&local_488);
        ::std::__cxx11::string::~string((string *)&local_488);
        merge(&local_4c8,
              (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
               *)local_2d8,", ");
        join<char_const(&)[19],std::__cxx11::string,char_const(&)[2]>
                  (&local_4a8,(spirv_cross *)", spvYCbCrSampler(",(char (*) [19])&local_4c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5b7d4b,
                   (char (*) [2])in_R8);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_4a8);
        ::std::__cxx11::string::~string((string *)&local_4a8);
        ::std::__cxx11::string::~string((string *)&local_4c8);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                        *)local_2d8);
      }
    }
    if ((((local_3d & 1) == 0) || (_i == (MSLConstexprSampler *)0x0)) ||
       ((_i->ycbcr_conversion_enable & 1U) == 0)) {
      if (((((this->msl_options).swizzle_texture_samples & 1U) != 0) &&
          ((this->has_sampled_images & 1U) != 0)) &&
         (bVar2 = Compiler::is_sampled_image_type((Compiler *)this,local_30), bVar2)) {
        if (var._4_4_ == 0) {
          local_798 = type._4_4_;
        }
        else {
          local_798 = var._4_4_;
        }
        to_swizzle_expression_abi_cxx11_(&local_5a8,this,local_798);
        ::std::operator+(&local_588,", ",&local_5a8);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_588);
        ::std::__cxx11::string::~string((string *)&local_588);
        ::std::__cxx11::string::~string((string *)&local_5a8);
      }
    }
    else {
      create_swizzle_abi_cxx11_(&local_508,_i->swizzle[3]);
      create_swizzle_abi_cxx11_(&local_528,_i->swizzle[2]);
      create_swizzle_abi_cxx11_(&local_548,_i->swizzle[1]);
      create_swizzle_abi_cxx11_(&local_568,_i->swizzle[0]);
      join<char_const(&)[9],std::__cxx11::string,char_const(&)[18],std::__cxx11::string,char_const(&)[18],std::__cxx11::string,char_const(&)[16],std::__cxx11::string,char_const(&)[2]>
                (&local_4e8,(spirv_cross *)", (uint(",(char (*) [9])&local_508,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ") << 24) | (uint(",(char (*) [18])&local_528,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ") << 16) | (uint(",(char (*) [18])&local_548,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ") << 8) | uint(",(char (*) [16])&local_568,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5b7d4b,
                 in_stack_fffffffffffff838);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_4e8);
      ::std::__cxx11::string::~string((string *)&local_4e8);
      ::std::__cxx11::string::~string((string *)&local_568);
      ::std::__cxx11::string::~string((string *)&local_548);
      ::std::__cxx11::string::~string((string *)&local_528);
      ::std::__cxx11::string::~string((string *)&local_508);
    }
    TypedID<(spirv_cross::Types)2>::TypedID(&local_5ac,var._4_4_);
    bVar2 = buffer_requires_array_length(this,local_5ac);
    if (bVar2) {
      if (var._4_4_ == 0) {
        local_7a0 = type._4_4_;
      }
      else {
        local_7a0 = var._4_4_;
      }
      to_buffer_size_expression_abi_cxx11_((string *)&backing_var,this,local_7a0);
      ::std::operator+(&local_5d0,", ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &backing_var);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_5d0);
      ::std::__cxx11::string::~string((string *)&local_5d0);
      ::std::__cxx11::string::~string((string *)&backing_var);
    }
    if ((local_3d & 1) != 0) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
    }
  }
  local_5f8 = Compiler::maybe_get_backing_variable((Compiler *)this,var._4_4_);
  bVar2 = false;
  if (local_5f8 != (SPIRVariable *)0x0) {
    local_5fc = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_5f8->super_IVariant).self)
    ;
    sVar8 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&this->atomic_image_vars_emulated,&local_5fc);
    bVar2 = sVar8 != 0;
  }
  if (bVar2) {
    CompilerGLSL::to_expression_abi_cxx11_(&local_660,&this->super_CompilerGLSL,var._4_4_,true);
    ::std::operator+(&local_640,", ",&local_660);
    ::std::operator+(&local_620,&local_640,"_atomic");
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_620);
    ::std::__cxx11::string::~string((string *)&local_620);
    ::std::__cxx11::string::~string((string *)&local_640);
    ::std::__cxx11::string::~string((string *)&local_660);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_func_call_arg(const SPIRFunction::Parameter &arg, uint32_t id)
{
	string arg_str;

	auto &type = expression_type(id);
	bool is_dynamic_img_sampler = has_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);
	// If the argument *itself* is a "dynamic" combined-image sampler, then we can just pass that around.
	bool arg_is_dynamic_img_sampler = has_extended_decoration(id, SPIRVCrossDecorationDynamicImageSampler);
	if (is_dynamic_img_sampler && !arg_is_dynamic_img_sampler)
		arg_str = join("spvDynamicImageSampler<", type_to_glsl(get<SPIRType>(type.image.type)), ">(");

	auto *c = maybe_get<SPIRConstant>(id);
	if (msl_options.force_native_arrays && c && !get<SPIRType>(c->constant_type).array.empty())
	{
		// If we are passing a constant array directly to a function for some reason,
		// the callee will expect an argument in thread const address space
		// (since we can only bind to arrays with references in MSL).
		// To resolve this, we must emit a copy in this address space.
		// This kind of code gen should be rare enough that performance is not a real concern.
		// Inline the SPIR-V to avoid this kind of suboptimal codegen.
		//
		// We risk calling this inside a continue block (invalid code),
		// so just create a thread local copy in the current function.
		arg_str = join("_", id, "_array_copy");
		auto &constants = current_function->constant_arrays_needed_on_stack;
		auto itr = find(begin(constants), end(constants), ID(id));
		if (itr == end(constants))
		{
			force_recompile();
			constants.push_back(id);
		}
	}
	// Dereference pointer variables where needed.
	// FIXME: This dereference is actually backwards. We should really just support passing pointer variables between functions.
	else if (should_dereference_caller_param(id))
		arg_str += dereference_expression(type, CompilerGLSL::to_func_call_arg(arg, id));
	else
		arg_str += CompilerGLSL::to_func_call_arg(arg, id);

	// Need to check the base variable in case we need to apply a qualified alias.
	uint32_t var_id = 0;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var)
		var_id = var->basevariable;

	if (!arg_is_dynamic_img_sampler)
	{
		auto *constexpr_sampler = find_constexpr_sampler(var_id ? var_id : id);
		if (type.basetype == SPIRType::SampledImage)
		{
			// Manufacture automatic plane args for multiplanar texture
			uint32_t planes = 1;
			if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
			{
				planes = constexpr_sampler->planes;
				// If this parameter isn't aliasing a global, then we need to use
				// the special "dynamic image-sampler" class to pass it--and we need
				// to use it for *every* non-alias parameter, in case a combined
				// image-sampler with a Y'CbCr conversion is passed. Hopefully, this
				// pathological case is so rare that it should never be hit in practice.
				if (!arg.alias_global_variable)
					add_spv_func_and_recompile(SPVFuncImplDynamicImageSampler);
			}
			for (uint32_t i = 1; i < planes; i++)
				arg_str += join(", ", CompilerGLSL::to_func_call_arg(arg, id), plane_name_suffix, i);
			// Manufacture automatic sampler arg if the arg is a SampledImage texture.
			if (type.image.dim != DimBuffer)
				arg_str += ", " + to_sampler_expression(var_id ? var_id : id);

			// Add sampler Y'CbCr conversion info if we have it
			if (is_dynamic_img_sampler && constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
			{
				SmallVector<string> samp_args;

				switch (constexpr_sampler->resolution)
				{
				case MSL_FORMAT_RESOLUTION_444:
					// Default
					break;
				case MSL_FORMAT_RESOLUTION_422:
					samp_args.push_back("spvFormatResolution::_422");
					break;
				case MSL_FORMAT_RESOLUTION_420:
					samp_args.push_back("spvFormatResolution::_420");
					break;
				default:
					SPIRV_CROSS_THROW("Invalid format resolution.");
				}

				if (constexpr_sampler->chroma_filter != MSL_SAMPLER_FILTER_NEAREST)
					samp_args.push_back("spvChromaFilter::linear");

				if (constexpr_sampler->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN)
					samp_args.push_back("spvXChromaLocation::midpoint");
				if (constexpr_sampler->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN)
					samp_args.push_back("spvYChromaLocation::midpoint");
				switch (constexpr_sampler->ycbcr_model)
				{
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
					// Default
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_identity");
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_bt_709");
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_bt_601");
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_bt_2020");
					break;
				default:
					SPIRV_CROSS_THROW("Invalid Y'CbCr model conversion.");
				}
				if (constexpr_sampler->ycbcr_range != MSL_SAMPLER_YCBCR_RANGE_ITU_FULL)
					samp_args.push_back("spvYCbCrRange::itu_narrow");
				samp_args.push_back(join("spvComponentBits(", constexpr_sampler->bpc, ")"));
				arg_str += join(", spvYCbCrSampler(", merge(samp_args), ")");
			}
		}

		if (is_dynamic_img_sampler && constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
			arg_str += join(", (uint(", create_swizzle(constexpr_sampler->swizzle[3]), ") << 24) | (uint(",
			                create_swizzle(constexpr_sampler->swizzle[2]), ") << 16) | (uint(",
			                create_swizzle(constexpr_sampler->swizzle[1]), ") << 8) | uint(",
			                create_swizzle(constexpr_sampler->swizzle[0]), ")");
		else if (msl_options.swizzle_texture_samples && has_sampled_images && is_sampled_image_type(type))
			arg_str += ", " + to_swizzle_expression(var_id ? var_id : id);

		if (buffer_requires_array_length(var_id))
			arg_str += ", " + to_buffer_size_expression(var_id ? var_id : id);

		if (is_dynamic_img_sampler)
			arg_str += ")";
	}

	// Emulate texture2D atomic operations
	auto *backing_var = maybe_get_backing_variable(var_id);
	if (backing_var && atomic_image_vars_emulated.count(backing_var->self))
	{
		arg_str += ", " + to_expression(var_id) + "_atomic";
	}

	return arg_str;
}